

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue JS_ReadFunctionTag(BCReaderState *s)

{
  JSValue JVar1;
  int iVar2;
  uint32_t uVar3;
  void *pvVar4;
  JSValueUnion *pJVar5;
  JSContext *pJVar6;
  undefined8 *in_RDI;
  JSValue JVar7;
  JSValue val;
  int var_idx;
  JSClosureVar *cv;
  JSVarDef *vd;
  int vardefs_offset;
  int closure_var_offset;
  int byte_code_offset;
  int cpool_offset;
  int function_size;
  int local_count;
  int i;
  int idx;
  uint8_t v8;
  uint16_t v16;
  JSValue obj;
  JSFunctionBytecode *b;
  JSFunctionBytecode bc;
  JSContext *ctx;
  undefined1 in_stack_fffffffffffffed8 [16];
  undefined1 auVar8 [12];
  JSValueUnion in_stack_fffffffffffffee8;
  JSContext *in_stack_fffffffffffffef0;
  uint32_t in_stack_fffffffffffffef8;
  int in_stack_fffffffffffffefc;
  JSFunctionBytecode *in_stack_ffffffffffffff00;
  BCReaderState *in_stack_ffffffffffffff08;
  int local_cc;
  int local_c8;
  int local_c4;
  int local_c0;
  byte local_bb;
  ushort local_ba;
  undefined4 *local_b8;
  int64_t local_b0;
  undefined4 *local_a8;
  undefined4 local_a0 [6];
  byte local_88;
  ushort local_87;
  int local_48;
  JSContext *local_20;
  undefined8 *local_18;
  undefined4 local_10;
  undefined4 uStack_c;
  int64_t local_8;
  
  local_20 = (JSContext *)*in_RDI;
  local_b8 = (undefined4 *)0x0;
  local_b0 = 3;
  local_18 = in_RDI;
  memset(local_a0,0,0x80);
  local_a0[0] = 1;
  iVar2 = bc_get_u16(in_stack_fffffffffffffed8._0_8_,(uint16_t *)0x16c0eb);
  pJVar6 = in_stack_fffffffffffffed8._8_8_;
  if (iVar2 == 0) {
    local_c0 = 0;
    uVar3 = bc_get_flags((uint)local_ba,&local_c0,1);
    local_87 = local_87 & 0xfffe | (ushort)uVar3 & 1;
    uVar3 = bc_get_flags((uint)local_ba,&local_c0,1);
    local_87 = local_87 & 0xfffd | ((ushort)uVar3 & 1) << 1;
    uVar3 = bc_get_flags((uint)local_ba,&local_c0,1);
    local_87 = local_87 & 0xfffb | ((ushort)uVar3 & 1) << 2;
    uVar3 = bc_get_flags((uint)local_ba,&local_c0,1);
    local_87 = local_87 & 0xfff7 | ((ushort)uVar3 & 1) << 3;
    uVar3 = bc_get_flags((uint)local_ba,&local_c0,2);
    local_87 = local_87 & 0xffcf | ((ushort)uVar3 & 3) << 4;
    uVar3 = bc_get_flags((uint)local_ba,&local_c0,1);
    local_87 = local_87 & 0xffbf | ((ushort)uVar3 & 1) << 6;
    uVar3 = bc_get_flags((uint)local_ba,&local_c0,1);
    local_87 = local_87 & 0xff7f | ((ushort)uVar3 & 1) << 7;
    uVar3 = bc_get_flags((uint)local_ba,&local_c0,1);
    local_87 = local_87 & 0xfeff | ((ushort)uVar3 & 1) << 8;
    uVar3 = bc_get_flags((uint)local_ba,&local_c0,1);
    local_87 = local_87 & 0xfdff | ((ushort)uVar3 & 1) << 9;
    uVar3 = bc_get_flags((uint)local_ba,&local_c0,1);
    local_87 = local_87 & 0xfbff | ((ushort)uVar3 & 1) << 10;
    uVar3 = bc_get_flags((uint)local_ba,&local_c0,1);
    local_87 = local_87 & 0xe7ff | ((ushort)uVar3 & 1) << 0xb |
               ((short)(char)((uint)*(undefined4 *)((long)local_18 + 0x34) >> 0x10) & 1U) << 0xc;
    iVar2 = bc_get_u8(in_stack_fffffffffffffed8._0_8_,(uint8_t *)0x16c3b3);
    pJVar6 = in_stack_fffffffffffffed8._8_8_;
    if (iVar2 == 0) {
      local_88 = local_bb;
      iVar2 = bc_get_atom((BCReaderState *)in_stack_fffffffffffffee8.ptr,(JSAtom *)pJVar6);
      pJVar6 = in_stack_fffffffffffffed8._8_8_;
      if (iVar2 == 0) {
        iVar2 = bc_get_leb128_u16((BCReaderState *)in_stack_fffffffffffffee8.ptr,(uint16_t *)pJVar6)
        ;
        pJVar6 = in_stack_fffffffffffffed8._8_8_;
        if (iVar2 == 0) {
          iVar2 = bc_get_leb128_u16((BCReaderState *)in_stack_fffffffffffffee8.ptr,
                                    (uint16_t *)pJVar6);
          pJVar6 = in_stack_fffffffffffffed8._8_8_;
          if (iVar2 == 0) {
            iVar2 = bc_get_leb128_u16((BCReaderState *)in_stack_fffffffffffffee8.ptr,
                                      (uint16_t *)pJVar6);
            pJVar6 = in_stack_fffffffffffffed8._8_8_;
            if (iVar2 == 0) {
              iVar2 = bc_get_leb128_u16((BCReaderState *)in_stack_fffffffffffffee8.ptr,
                                        (uint16_t *)pJVar6);
              pJVar6 = in_stack_fffffffffffffed8._8_8_;
              if (iVar2 == 0) {
                iVar2 = bc_get_leb128_int((BCReaderState *)pJVar6,in_stack_fffffffffffffed8._0_8_);
                pJVar6 = in_stack_fffffffffffffed8._8_8_;
                if (iVar2 == 0) {
                  iVar2 = bc_get_leb128_int((BCReaderState *)pJVar6,in_stack_fffffffffffffed8._0_8_)
                  ;
                  pJVar6 = in_stack_fffffffffffffed8._8_8_;
                  if (iVar2 == 0) {
                    iVar2 = bc_get_leb128_int((BCReaderState *)pJVar6,
                                              in_stack_fffffffffffffed8._0_8_);
                    pJVar6 = in_stack_fffffffffffffed8._8_8_;
                    if (iVar2 == 0) {
                      iVar2 = bc_get_leb128_int((BCReaderState *)pJVar6,
                                                in_stack_fffffffffffffed8._0_8_);
                      pJVar6 = in_stack_fffffffffffffed8._8_8_;
                      if (iVar2 == 0) {
                        if ((local_87 >> 10 & 1) == 0) {
                          local_cc = 0x60;
                        }
                        else {
                          local_cc = 0x80;
                        }
                        iVar2 = local_cc + local_48 * 0x10;
                        local_a8 = (undefined4 *)
                                   js_mallocz((JSContext *)
                                              CONCAT44(in_stack_fffffffffffffefc,
                                                       in_stack_fffffffffffffef8),
                                              (size_t)in_stack_fffffffffffffef0);
                        if (local_a8 == (undefined4 *)0x0) {
                          local_10 = 0;
                          local_8 = 6;
                          goto LAB_0016cc46;
                        }
                        memcpy(local_a8,local_a0,0x60);
                        *local_a8 = 1;
                        if (local_c8 != 0) {
                          *(long *)(local_a8 + 0xc) = (long)local_a8 + (long)iVar2;
                        }
                        if (local_a8[0x17] != 0) {
                          *(long *)(local_a8 + 0xe) =
                               (long)local_a8 + (long)(iVar2 + local_c8 * 0x10);
                        }
                        if (local_a8[0x16] != 0) {
                          *(long *)(local_a8 + 0x14) = (long)local_a8 + (long)local_cc;
                        }
                        add_gc_object(in_stack_fffffffffffffed8._8_8_,
                                      in_stack_fffffffffffffed8._0_8_,JS_GC_OBJ_TYPE_JS_OBJECT);
                        local_b8 = local_a8;
                        local_b0 = -2;
                        if (local_c8 != 0) {
                          for (local_c4 = 0; local_c4 < local_c8; local_c4 = local_c4 + 1) {
                            in_stack_ffffffffffffff08 =
                                 (BCReaderState *)
                                 (*(long *)(local_a8 + 0xc) + (long)local_c4 * 0x10);
                            iVar2 = bc_get_atom((BCReaderState *)in_stack_fffffffffffffee8.ptr,
                                                in_stack_fffffffffffffed8._8_8_);
                            pJVar6 = in_stack_fffffffffffffed8._8_8_;
                            if (iVar2 != 0) goto LAB_0016cc18;
                            iVar2 = bc_get_leb128_int((BCReaderState *)pJVar6,
                                                      in_stack_fffffffffffffed8._0_8_);
                            pJVar6 = in_stack_fffffffffffffed8._8_8_;
                            if (iVar2 != 0) goto LAB_0016cc18;
                            iVar2 = bc_get_leb128_int((BCReaderState *)pJVar6,
                                                      in_stack_fffffffffffffed8._0_8_);
                            pJVar6 = in_stack_fffffffffffffed8._8_8_;
                            if (iVar2 != 0) goto LAB_0016cc18;
                            *(int *)&in_stack_ffffffffffffff08->buf_start =
                                 *(int *)&in_stack_ffffffffffffff08->buf_start + -1;
                            iVar2 = bc_get_u8(in_stack_fffffffffffffed8._0_8_,(uint8_t *)0x16c78c);
                            pJVar6 = in_stack_fffffffffffffed8._8_8_;
                            if (iVar2 != 0) goto LAB_0016cc18;
                            local_c0 = 0;
                            uVar3 = bc_get_flags((uint)local_bb,&local_c0,4);
                            *(uint *)((long)&in_stack_ffffffffffffff08->buf_start + 4) =
                                 *(uint *)((long)&in_stack_ffffffffffffff08->buf_start + 4) &
                                 0xffffff87 | (uVar3 & 0xf) << 3;
                            uVar3 = bc_get_flags((uint)local_bb,&local_c0,1);
                            *(uint *)((long)&in_stack_ffffffffffffff08->buf_start + 4) =
                                 *(uint *)((long)&in_stack_ffffffffffffff08->buf_start + 4) &
                                 0xfffffffe | uVar3 & 1;
                            uVar3 = bc_get_flags((uint)local_bb,&local_c0,1);
                            *(uint *)((long)&in_stack_ffffffffffffff08->buf_start + 4) =
                                 *(uint *)((long)&in_stack_ffffffffffffff08->buf_start + 4) &
                                 0xfffffffd | (uVar3 & 1) << 1;
                            uVar3 = bc_get_flags((uint)local_bb,&local_c0,1);
                            *(uint *)((long)&in_stack_ffffffffffffff08->buf_start + 4) =
                                 *(uint *)((long)&in_stack_ffffffffffffff08->buf_start + 4) &
                                 0xfffffffb | (uVar3 & 1) << 2;
                          }
                        }
                        if (local_a8[0x17] != 0) {
                          for (local_c4 = 0; local_c4 < (int)local_a8[0x17]; local_c4 = local_c4 + 1
                              ) {
                            in_stack_ffffffffffffff00 =
                                 (JSFunctionBytecode *)
                                 (*(long *)(local_a8 + 0xe) + (long)local_c4 * 8);
                            iVar2 = bc_get_atom((BCReaderState *)in_stack_fffffffffffffee8.ptr,
                                                in_stack_fffffffffffffed8._8_8_);
                            pJVar6 = in_stack_fffffffffffffed8._8_8_;
                            if (iVar2 != 0) goto LAB_0016cc18;
                            iVar2 = bc_get_leb128_int((BCReaderState *)pJVar6,
                                                      in_stack_fffffffffffffed8._0_8_);
                            pJVar6 = in_stack_fffffffffffffed8._8_8_;
                            if (iVar2 != 0) goto LAB_0016cc18;
                            *(short *)((long)&(in_stack_ffffffffffffff00->header).ref_count + 2) =
                                 (short)in_stack_fffffffffffffefc;
                            iVar2 = bc_get_u8(in_stack_fffffffffffffed8._0_8_,(uint8_t *)0x16c912);
                            pJVar6 = in_stack_fffffffffffffed8._8_8_;
                            if (iVar2 != 0) goto LAB_0016cc18;
                            local_c0 = 0;
                            uVar3 = bc_get_flags((uint)local_bb,&local_c0,1);
                            *(byte *)&(in_stack_ffffffffffffff00->header).ref_count =
                                 (byte)(in_stack_ffffffffffffff00->header).ref_count & 0xfe |
                                 (byte)uVar3 & 1;
                            uVar3 = bc_get_flags((uint)local_bb,&local_c0,1);
                            *(byte *)&(in_stack_ffffffffffffff00->header).ref_count =
                                 (byte)(in_stack_ffffffffffffff00->header).ref_count & 0xfd |
                                 ((byte)uVar3 & 1) << 1;
                            uVar3 = bc_get_flags((uint)local_bb,&local_c0,1);
                            *(byte *)&(in_stack_ffffffffffffff00->header).ref_count =
                                 (byte)(in_stack_ffffffffffffff00->header).ref_count & 0xfb |
                                 ((byte)uVar3 & 1) << 2;
                            uVar3 = bc_get_flags((uint)local_bb,&local_c0,1);
                            *(byte *)&(in_stack_ffffffffffffff00->header).ref_count =
                                 (byte)(in_stack_ffffffffffffff00->header).ref_count & 0xf7 |
                                 ((byte)uVar3 & 1) << 3;
                            uVar3 = bc_get_flags((uint)local_bb,&local_c0,4);
                            *(byte *)&(in_stack_ffffffffffffff00->header).ref_count =
                                 (byte)(in_stack_ffffffffffffff00->header).ref_count & 0xf |
                                 (char)uVar3 << 4;
                          }
                        }
                        iVar2 = JS_ReadFunctionBytecode
                                          (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                                           in_stack_fffffffffffffefc,in_stack_fffffffffffffef8);
                        pJVar6 = in_stack_fffffffffffffed8._8_8_;
                        if (iVar2 == 0) {
                          if ((*(ushort *)((long)local_a8 + 0x19) >> 10 & 1) == 0)
                          goto LAB_0016cb3b;
                          iVar2 = bc_get_atom((BCReaderState *)in_stack_fffffffffffffee8.ptr,
                                              (JSAtom *)pJVar6);
                          pJVar6 = in_stack_fffffffffffffed8._8_8_;
                          if (iVar2 == 0) {
                            iVar2 = bc_get_leb128_int((BCReaderState *)pJVar6,
                                                      in_stack_fffffffffffffed8._0_8_);
                            auVar8 = in_stack_fffffffffffffed8._8_12_;
                            pJVar6 = in_stack_fffffffffffffed8._8_8_;
                            if (iVar2 == 0) {
                              iVar2 = bc_get_leb128_int((BCReaderState *)pJVar6,
                                                        in_stack_fffffffffffffed8._0_8_);
                              pJVar6 = auVar8._0_8_;
                              if (iVar2 == 0) {
                                if (local_a8[0x1b] != 0) {
                                  pvVar4 = js_mallocz((JSContext *)
                                                      CONCAT44(in_stack_fffffffffffffefc,
                                                               in_stack_fffffffffffffef8),
                                                      (size_t)in_stack_fffffffffffffef0);
                                  pJVar6 = auVar8._4_8_;
                                  *(void **)(local_a8 + 0x1c) = pvVar4;
                                  if ((*(long *)(local_a8 + 0x1c) == 0) ||
                                     (iVar2 = bc_get_buf((BCReaderState *)
                                                         in_stack_fffffffffffffee8.ptr,
                                                         (uint8_t *)pJVar6,auVar8._0_4_), iVar2 != 0
                                     )) goto LAB_0016cc18;
                                }
LAB_0016cb3b:
                                if (local_a8[0x16] != 0) {
                                  for (local_c4 = 0; local_c4 < (int)local_a8[0x16];
                                      local_c4 = local_c4 + 1) {
                                    JVar7 = JS_ReadObjectRec((BCReaderState *)vd);
                                    in_stack_fffffffffffffee8 = JVar7.u;
                                    in_stack_fffffffffffffef0 = (JSContext *)JVar7.tag;
                                    pJVar6 = in_stack_fffffffffffffef0;
                                    iVar2 = JS_IsException(JVar7);
                                    if (iVar2 != 0) goto LAB_0016cc18;
                                    pJVar5 = (JSValueUnion *)
                                             (*(long *)(local_a8 + 0x14) + (long)local_c4 * 0x10);
                                    pJVar5->ptr = (void *)in_stack_fffffffffffffee8;
                                    pJVar5[1].ptr = in_stack_fffffffffffffef0;
                                  }
                                }
                                pJVar6 = JS_DupContext(local_20);
                                *(JSContext **)(local_a8 + 0x12) = pJVar6;
                                local_10 = SUB84(local_b8,0);
                                uStack_c = (undefined4)((ulong)local_b8 >> 0x20);
                                local_8 = local_b0;
                                goto LAB_0016cc46;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_0016cc18:
  JVar7.tag = (int64_t)in_stack_fffffffffffffef0;
  JVar7.u.ptr = in_stack_fffffffffffffee8.ptr;
  JS_FreeValue(pJVar6,JVar7);
  local_10 = 0;
  local_8 = 6;
LAB_0016cc46:
  JVar1.u._4_4_ = uStack_c;
  JVar1.u.int32 = local_10;
  JVar1.tag = local_8;
  return JVar1;
}

Assistant:

static JSValue JS_ReadFunctionTag(BCReaderState *s)
{
    JSContext *ctx = s->ctx;
    JSFunctionBytecode bc, *b;
    JSValue obj = JS_UNDEFINED;
    uint16_t v16;
    uint8_t v8;
    int idx, i, local_count;
    int function_size, cpool_offset, byte_code_offset;
    int closure_var_offset, vardefs_offset;

    memset(&bc, 0, sizeof(bc));
    bc.header.ref_count = 1;
    //bc.gc_header.mark = 0;

    if (bc_get_u16(s, &v16))
        goto fail;
    idx = 0;
    bc.has_prototype = bc_get_flags(v16, &idx, 1);
    bc.has_simple_parameter_list = bc_get_flags(v16, &idx, 1);
    bc.is_derived_class_constructor = bc_get_flags(v16, &idx, 1);
    bc.need_home_object = bc_get_flags(v16, &idx, 1);
    bc.func_kind = bc_get_flags(v16, &idx, 2);
    bc.new_target_allowed = bc_get_flags(v16, &idx, 1);
    bc.super_call_allowed = bc_get_flags(v16, &idx, 1);
    bc.super_allowed = bc_get_flags(v16, &idx, 1);
    bc.arguments_allowed = bc_get_flags(v16, &idx, 1);
    bc.has_debug = bc_get_flags(v16, &idx, 1);
    bc.backtrace_barrier = bc_get_flags(v16, &idx, 1);
    bc.read_only_bytecode = s->is_rom_data;
    if (bc_get_u8(s, &v8))
        goto fail;
    bc.js_mode = v8;
    if (bc_get_atom(s, &bc.func_name))  //@ atom leak if failure
        goto fail;
    if (bc_get_leb128_u16(s, &bc.arg_count))
        goto fail;
    if (bc_get_leb128_u16(s, &bc.var_count))
        goto fail;
    if (bc_get_leb128_u16(s, &bc.defined_arg_count))
        goto fail;
    if (bc_get_leb128_u16(s, &bc.stack_size))
        goto fail;
    if (bc_get_leb128_int(s, &bc.closure_var_count))
        goto fail;
    if (bc_get_leb128_int(s, &bc.cpool_count))
        goto fail;
    if (bc_get_leb128_int(s, &bc.byte_code_len))
        goto fail;
    if (bc_get_leb128_int(s, &local_count))
        goto fail;

    if (bc.has_debug) {
        function_size = sizeof(*b);
    } else {
        function_size = offsetof(JSFunctionBytecode, debug);
    }
    cpool_offset = function_size;
    function_size += bc.cpool_count * sizeof(*bc.cpool);
    vardefs_offset = function_size;
    function_size += local_count * sizeof(*bc.vardefs);
    closure_var_offset = function_size;
    function_size += bc.closure_var_count * sizeof(*bc.closure_var);
    byte_code_offset = function_size;
    if (!bc.read_only_bytecode) {
        function_size += bc.byte_code_len;
    }

    b = js_mallocz(ctx, function_size);
    if (!b)
        return JS_EXCEPTION;
            
    memcpy(b, &bc, offsetof(JSFunctionBytecode, debug));
    b->header.ref_count = 1;
    if (local_count != 0) {
        b->vardefs = (void *)((uint8_t*)b + vardefs_offset);
    }
    if (b->closure_var_count != 0) {
        b->closure_var = (void *)((uint8_t*)b + closure_var_offset);
    }
    if (b->cpool_count != 0) {
        b->cpool = (void *)((uint8_t*)b + cpool_offset);
    }
    
    add_gc_object(ctx->rt, &b->header, JS_GC_OBJ_TYPE_FUNCTION_BYTECODE);
            
    obj = JS_MKPTR(JS_TAG_FUNCTION_BYTECODE, b);

#ifdef DUMP_READ_OBJECT
    bc_read_trace(s, "name: "); print_atom(s->ctx, b->func_name); printf("\n");
#endif
    bc_read_trace(s, "args=%d vars=%d defargs=%d closures=%d cpool=%d\n",
                  b->arg_count, b->var_count, b->defined_arg_count,
                  b->closure_var_count, b->cpool_count);
    bc_read_trace(s, "stack=%d bclen=%d locals=%d\n",
                  b->stack_size, b->byte_code_len, local_count);

    if (local_count != 0) {
        bc_read_trace(s, "vars {\n");
        for(i = 0; i < local_count; i++) {
            JSVarDef *vd = &b->vardefs[i];
            if (bc_get_atom(s, &vd->var_name))
                goto fail;
            if (bc_get_leb128_int(s, &vd->scope_level))
                goto fail;
            if (bc_get_leb128_int(s, &vd->scope_next))
                goto fail;
            vd->scope_next--;
            if (bc_get_u8(s, &v8))
                goto fail;
            idx = 0;
            vd->var_kind = bc_get_flags(v8, &idx, 4);
            vd->is_const = bc_get_flags(v8, &idx, 1);
            vd->is_lexical = bc_get_flags(v8, &idx, 1);
            vd->is_captured = bc_get_flags(v8, &idx, 1);
#ifdef DUMP_READ_OBJECT
            bc_read_trace(s, "name: "); print_atom(s->ctx, vd->var_name); printf("\n");
#endif
        }
        bc_read_trace(s, "}\n");
    }
    if (b->closure_var_count != 0) {
        bc_read_trace(s, "closure vars {\n");
        for(i = 0; i < b->closure_var_count; i++) {
            JSClosureVar *cv = &b->closure_var[i];
            int var_idx;
            if (bc_get_atom(s, &cv->var_name))
                goto fail;
            if (bc_get_leb128_int(s, &var_idx))
                goto fail;
            cv->var_idx = var_idx;
            if (bc_get_u8(s, &v8))
                goto fail;
            idx = 0;
            cv->is_local = bc_get_flags(v8, &idx, 1);
            cv->is_arg = bc_get_flags(v8, &idx, 1);
            cv->is_const = bc_get_flags(v8, &idx, 1);
            cv->is_lexical = bc_get_flags(v8, &idx, 1);
            cv->var_kind = bc_get_flags(v8, &idx, 4);
#ifdef DUMP_READ_OBJECT
            bc_read_trace(s, "name: "); print_atom(s->ctx, cv->var_name); printf("\n");
#endif
        }
        bc_read_trace(s, "}\n");
    }
    {
        bc_read_trace(s, "bytecode {\n");
        if (JS_ReadFunctionBytecode(s, b, byte_code_offset, b->byte_code_len))
            goto fail;
        bc_read_trace(s, "}\n");
    }
    if (b->has_debug) {
        /* read optional debug information */
        bc_read_trace(s, "debug {\n");
        if (bc_get_atom(s, &b->debug.filename))
            goto fail;
        if (bc_get_leb128_int(s, &b->debug.line_num))
            goto fail;
        if (bc_get_leb128_int(s, &b->debug.pc2line_len))
            goto fail;
        if (b->debug.pc2line_len) {
            b->debug.pc2line_buf = js_mallocz(ctx, b->debug.pc2line_len);
            if (!b->debug.pc2line_buf)
                goto fail;
            if (bc_get_buf(s, b->debug.pc2line_buf, b->debug.pc2line_len))
                goto fail;
        }
#ifdef DUMP_READ_OBJECT
        bc_read_trace(s, "filename: "); print_atom(s->ctx, b->debug.filename); printf("\n");
#endif
        bc_read_trace(s, "}\n");
    }
    if (b->cpool_count != 0) {
        bc_read_trace(s, "cpool {\n");
        for(i = 0; i < b->cpool_count; i++) {
            JSValue val;
            val = JS_ReadObjectRec(s);
            if (JS_IsException(val))
                goto fail;
            b->cpool[i] = val;
        }
        bc_read_trace(s, "}\n");
    }
    b->realm = JS_DupContext(ctx);
    return obj;
 fail:
    JS_FreeValue(ctx, obj);
    return JS_EXCEPTION;
}